

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# casts.h
# Opt level: O3

void __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint::CheckTypeAndMergeFrom
          (VisionFeaturePrint *this,MessageLite *from)

{
  int iVar1;
  ulong uVar2;
  LogMessage *other;
  VisionFeaturePrint_Objects *this_00;
  VisionFeaturePrint_Scene *this_01;
  undefined1 *puVar3;
  Arena *pAVar4;
  LogFinisher LStack_51;
  LogMessage LStack_50;
  
  if (from->_vptr_MessageLite != (_func_int **)&PTR__VisionFeaturePrint_0048f680) {
    __assert_fail("f == nullptr || dynamic_cast<To>(f) != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/stubs/casts.h"
                  ,0x5e,
                  "To google::protobuf::internal::down_cast(From *) [To = const CoreML::Specification::CoreMLModels::VisionFeaturePrint *, From = const google::protobuf::MessageLite]"
                 );
  }
  if ((VisionFeaturePrint *)from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&LStack_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O3/mlmodel/format/VisionFeaturePrint.pb.cc"
               ,0x342);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&LStack_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&LStack_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&LStack_50);
  }
  iVar1 = *(int *)((long)&from[1]._internal_metadata_.ptr_ + 4);
  if (iVar1 != 0x14) {
    if (iVar1 != 0x15) goto LAB_002cb63e;
    if (this->_oneof_case_[0] == 0x15) {
      this_00 = (this->VisionFeaturePrintType_).objects_;
LAB_002cb5e7:
      puVar3 = (undefined1 *)from[1]._vptr_MessageLite;
    }
    else {
      clear_VisionFeaturePrintType(this);
      this->_oneof_case_[0] = 0x15;
      uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
      pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
      if ((uVar2 & 1) != 0) {
        pAVar4 = *(Arena **)pAVar4;
      }
      this_00 = google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects>
                          (pAVar4);
      (this->VisionFeaturePrintType_).objects_ = this_00;
      if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 0x15) goto LAB_002cb5e7;
      puVar3 = _VisionFeaturePrint_Objects_default_instance_;
    }
    VisionFeaturePrint_Objects::MergeFrom(this_00,(VisionFeaturePrint_Objects *)puVar3);
    goto LAB_002cb63e;
  }
  if (this->_oneof_case_[0] == 0x14) {
    this_01 = (this->VisionFeaturePrintType_).scene_;
LAB_002cb61e:
    puVar3 = (undefined1 *)from[1]._vptr_MessageLite;
  }
  else {
    clear_VisionFeaturePrintType(this);
    this->_oneof_case_[0] = 0x14;
    uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
    pAVar4 = (Arena *)(uVar2 & 0xfffffffffffffffc);
    if ((uVar2 & 1) != 0) {
      pAVar4 = *(Arena **)pAVar4;
    }
    this_01 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::CoreMLModels::VisionFeaturePrint_Scene>
                        (pAVar4);
    (this->VisionFeaturePrintType_).scene_ = this_01;
    if (*(int *)((long)&from[1]._internal_metadata_.ptr_ + 4) == 0x14) goto LAB_002cb61e;
    puVar3 = _VisionFeaturePrint_Scene_default_instance_;
  }
  VisionFeaturePrint_Scene::MergeFrom(this_01,(VisionFeaturePrint_Scene *)puVar3);
LAB_002cb63e:
  uVar2 = (from->_internal_metadata_).ptr_;
  if ((uVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar2 & 0xfffffffffffffffc) + 8));
  }
  return;
}

Assistant:

inline To down_cast(From* f) {                   // so we only accept pointers
  // Ensures that To is a sub-type of From *.  This test is here only
  // for compile-time type checking, and has no overhead in an
  // optimized build at run-time, as it will be optimized away
  // completely.
  if (false) {
    implicit_cast<From*, To>(0);
  }

#if !defined(NDEBUG) && PROTOBUF_RTTI
  assert(f == nullptr || dynamic_cast<To>(f) != nullptr);  // RTTI: debug mode only!
#endif
  return static_cast<To>(f);
}